

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file.cpp
# Opt level: O0

void __thiscall cppcms::http::file::impl_data::impl_data(impl_data *this)

{
  streambuf *in_RDI;
  size_t in_stack_00000008;
  file_buffer *in_stack_00000010;
  
  impl::file_buffer::file_buffer(in_stack_00000010,in_stack_00000008);
  std::istream::istream(in_RDI + 0xf8,in_RDI);
  std::ostream::ostream(in_RDI + 0x210,in_RDI);
  return;
}

Assistant:

impl_data() :
		in(&fb),
		out(&fb)
	{
	}